

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestEmptyBinaryDirectoryCommand.h
# Opt level: O0

void __thiscall
cmCTestEmptyBinaryDirectoryCommand::~cmCTestEmptyBinaryDirectoryCommand
          (cmCTestEmptyBinaryDirectoryCommand *this)

{
  cmCTestEmptyBinaryDirectoryCommand *this_local;
  
  ~cmCTestEmptyBinaryDirectoryCommand(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestEmptyBinaryDirectoryCommand() {}